

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Part_One_t * Part_ManMergeEntry(Part_Man_t *pMan,Part_One_t *p1,Part_One_t *p2,int nRefs)

{
  Part_One_t *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Part_One_t *pPVar5;
  Part_One_t *pPVar6;
  Part_One_t *pPVar7;
  Part_One_t *pPVar8;
  int iVar9;
  
  iVar9 = p2->nOuts + p1->nOuts;
  pPVar5 = (Part_One_t *)Part_ManFetch(pMan,iVar9 * 4 + 0xc);
  pPVar5->nRefs = nRefs;
  pPVar5->nOuts = 0;
  pPVar5->nOutsAlloc = iVar9;
  pPVar8 = p1 + 1;
  pPVar6 = p2 + 1;
  pPVar1 = pPVar5 + 1;
  iVar9 = p1->nOuts;
  iVar2 = p2->nOuts;
  pPVar7 = pPVar1;
  if (0 < iVar2 && 0 < (long)iVar9) {
    do {
      iVar3 = pPVar8->nRefs;
      iVar4 = pPVar6->nRefs;
      if (iVar3 == iVar4) {
        pPVar8 = (Part_One_t *)&pPVar8->nOuts;
        pPVar7->nRefs = iVar3;
        pPVar6 = (Part_One_t *)&pPVar6->nOuts;
      }
      else if (iVar3 < iVar4) {
        pPVar8 = (Part_One_t *)&pPVar8->nOuts;
        pPVar7->nRefs = iVar3;
      }
      else {
        pPVar6 = (Part_One_t *)&pPVar6->nOuts;
        pPVar7->nRefs = iVar4;
      }
      pPVar7 = (Part_One_t *)&pPVar7->nOuts;
    } while ((pPVar8 < (Part_One_t *)(&p1[1].nRefs + iVar9)) &&
            (pPVar6 < (Part_One_t *)(&p2[1].nRefs + iVar2)));
  }
  for (; pPVar8 < (Part_One_t *)(&p1[1].nRefs + iVar9); pPVar8 = (Part_One_t *)&pPVar8->nOuts) {
    pPVar7->nRefs = pPVar8->nRefs;
    pPVar7 = (Part_One_t *)&pPVar7->nOuts;
  }
  for (; pPVar6 < (Part_One_t *)(&p2[1].nRefs + iVar2); pPVar6 = (Part_One_t *)&pPVar6->nOuts) {
    pPVar7->nRefs = pPVar6->nRefs;
    pPVar7 = (Part_One_t *)&pPVar7->nOuts;
  }
  iVar9 = (int)((ulong)((long)pPVar7 - (long)pPVar1) >> 2);
  pPVar5->nOuts = iVar9;
  if (pPVar5->nOutsAlloc < iVar9) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0xea,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (iVar9 < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0xeb,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (iVar9 < p2->nOuts) {
    __assert_fail("p->nOuts >= p2->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0xec,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  return pPVar5;
}

Assistant:

Part_One_t * Part_ManMergeEntry( Part_Man_t * pMan, Part_One_t * p1, Part_One_t * p2, int nRefs )
{
    Part_One_t * p = Part_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}